

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::processCommandInstruction(CommonCore *this,ActionMessage *command)

{
  GlobalFederateId sourceId;
  GlobalFederateId destId;
  string_view message;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  string_view str;
  string_view name;
  format_args args;
  string warnString;
  pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_f8;
  ActionMessage warn;
  
  BrokerBase::processBaseCommands(&local_f8,&this->super_BrokerBase,command);
  if (local_f8.first == false) {
    warn._8_8_ = (local_f8.second.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_len;
    warn._0_8_ = (local_f8.second.
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_str;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x25;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&warn;
    ::fmt::v11::vformat_abi_cxx11_
              (&warnString,(v11 *)"Unrecognized command instruction \"{}\"",fmt,args);
    message._M_str = warnString._M_dataplus._M_p;
    message._M_len = warnString._M_string_length;
    name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    name._M_len = (this->super_BrokerBase).identifier._M_string_length;
    BrokerBase::sendToLogger
              (&this->super_BrokerBase,
               (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,3,name,message,
               false);
    sourceId.gid = (this->super_BrokerBase).global_broker_id_local.gid;
    destId.gid = (command->source_id).gid;
    if (destId.gid != sourceId.gid) {
      ActionMessage::ActionMessage(&warn,cmd_warning,sourceId,destId);
      SmallBuffer::operator=(&warn.payload,&warnString);
      warn.messageID = 3;
      str._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      str._M_len = (this->super_BrokerBase).identifier._M_string_length;
      ActionMessage::setString(&warn,0,str);
      routeMessage(this,&warn);
      ActionMessage::~ActionMessage(&warn);
    }
    std::__cxx11::string::~string((string *)&warnString);
  }
  CLI::std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&local_f8.second.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
  return;
}

Assistant:

void CommonCore::processCommandInstruction(ActionMessage& command)
{
    auto [processed, res] = processBaseCommands(command);
    if (processed) {
        return;
    }
    auto warnString = fmt::format("Unrecognized command instruction \"{}\"", res[0]);
    LOG_WARNING(global_broker_id_local, getIdentifier(), warnString);
    if (command.source_id != global_broker_id_local) {
        ActionMessage warn(CMD_WARNING, global_broker_id_local, command.source_id);
        warn.payload = std::move(warnString);
        warn.messageID = HELICS_LOG_LEVEL_WARNING;
        warn.setString(0, getIdentifier());
        routeMessage(warn);
    }
}